

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URITest.cpp
# Opt level: O2

void __thiscall
jaegertracing::net::URI_queryEscape_Test::~URI_queryEscape_Test(URI_queryEscape_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(URI, queryEscape)
{
    ASSERT_EQ("hello%20world", URI::queryEscape("hello world"));
    ASSERT_EQ("hello-world", URI::queryEscape("hello-world"));
    ASSERT_EQ("hello.world", URI::queryEscape("hello.world"));
    ASSERT_EQ("hello_world", URI::queryEscape("hello_world"));
    ASSERT_EQ("hello~world", URI::queryEscape("hello~world"));
    ASSERT_EQ("hello%3Aworld", URI::queryEscape("hello:world"));
}